

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  istream *piVar1;
  char cVar2;
  bool bVar3;
  
  piVar1 = state->reader_->in_;
  if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
    cVar2 = std::istream::peek();
    bVar3 = (byte)(cVar2 - 0x30U) < 10;
    if ((bVar3) &&
       (piVar1 = state->reader_->in_, bVar3 = true,
       *(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0)) {
      std::istream::get();
    }
  }
  else {
    bVar3 = false;
  }
  if (bVar3 != false) {
    while (piVar1 = state->reader_->in_,
          *(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
        return bVar3;
      }
      cVar2 = std::istream::peek();
      if (9 < (byte)(cVar2 - 0x30U)) {
        return bVar3;
      }
      piVar1 = state->reader_->in_;
      if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
        std::istream::get();
      }
    }
  }
  return bVar3;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }